

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ReservedExtensionRangeAdjacent_Test::
TestBody(ValidationErrorTest_ReservedExtensionRangeAdjacent_Test *this)

{
  string_view file_text;
  
  file_text._M_str =
       "name: \"foo.proto\" message_type {  name: \"Foo\"  extension_range { start: 10 end: 20 }  reserved_range { start: 5 end: 10 }}"
  ;
  file_text._M_len = 0x7a;
  ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,file_text);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ReservedExtensionRangeAdjacent) {
  BuildFile(
      "name: \"foo.proto\" "
      "message_type {"
      "  name: \"Foo\""
      "  extension_range { start: 10 end: 20 }"
      "  reserved_range { start: 5 end: 10 }"
      "}");
}